

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_mac_abort(psa_mac_operation_t *operation)

{
  uint uVar1;
  
  uVar1 = operation->alg;
  if (uVar1 != 0) {
    if (uVar1 == 0x2c00002) {
      mbedtls_cipher_free(&(operation->ctx).cmac);
    }
    else {
      if ((uVar1 & 0x7fc00000) != 0x2800000) {
        memset(operation,0,0x168);
        return -0x89;
      }
      mbedtls_platform_zeroize((void *)((long)&operation->ctx + 0xe0),0x80);
      psa_hash_abort(&(operation->ctx).hmac.hash_ctx);
    }
    operation->alg = 0;
    operation->field_0x4 = operation->field_0x4 & 0xe0;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

psa_status_t psa_mac_abort( psa_mac_operation_t *operation )
{
    if( operation->alg == 0 )
    {
        /* The object has (apparently) been initialized but it is not
         * in use. It's ok to call abort on such an object, and there's
         * nothing to do. */
        return( PSA_SUCCESS );
    }
    else
#if defined(MBEDTLS_CMAC_C)
    if( operation->alg == PSA_ALG_CMAC )
    {
        mbedtls_cipher_free( &operation->ctx.cmac );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( operation->alg ) )
    {
        psa_hmac_abort_internal( &operation->ctx.hmac );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* Sanity check (shouldn't happen: operation->alg should
         * always have been initialized to a valid value). */
        goto bad_state;
    }

    operation->alg = 0;
    operation->key_set = 0;
    operation->iv_set = 0;
    operation->iv_required = 0;
    operation->has_input = 0;
    operation->is_sign = 0;

    return( PSA_SUCCESS );

bad_state:
    /* If abort is called on an uninitialized object, we can't trust
     * anything. Wipe the object in case it contains confidential data.
     * This may result in a memory leak if a pointer gets overwritten,
     * but it's too late to do anything about this. */
    memset( operation, 0, sizeof( *operation ) );
    return( PSA_ERROR_BAD_STATE );
}